

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall customCountUnits_testAllInv_Test::TestBody(customCountUnits_testAllInv_Test *this)

{
  uint uVar1;
  unit_data uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer *__ptr;
  char *in_R9;
  long lVar6;
  bool bVar7;
  precise_unit cunit3;
  precise_unit cunit2;
  precise_unit cunit1;
  AssertHelper local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  string local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  undefined8 local_58;
  AssertHelper local_50;
  precise_unit local_48;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  iVar5 = 0;
  lVar6 = 0;
  do {
    uVar3 = (((uint)lVar6 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
    uVar3 = (uVar3 >> 2 & 0x10013000) + (uVar3 & 0x30010000) * 4;
    uVar3 = (uVar3 >> 1 & 0x40001000) + (uVar3 & 0x50051000) * 2 >> 1;
    local_48._8_8_ = ZEXT48(uVar3 | iVar5 >> 0x11 & 0xc000U);
    local_48.multiplier_ = 1.0;
    local_60[0] = 1;
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((uVar3 & 0x180000) == 0x100000) {
      uVar1 = (int)(uVar3 << 0x12) >> 0x1d;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      local_60[0] = uVar3 < 2;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (uVar3 >= 2) {
        testing::Message::Message((Message *)local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_90,(internal *)local_60,
                   (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                   ,0x45b,local_90._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_70 + 8))();
        }
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
      }
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(1.0 / local_48.multiplier_);
    uVar2 = units::detail::unit_data::inv(&local_48.base_units_);
    uVar3 = ~local_48.commodity_;
    if (local_48.commodity_ == 0) {
      uVar3 = 0;
    }
    local_58._4_4_ = uVar3;
    local_58._0_4_ = uVar2;
    local_60 = (undefined1  [8])
               local_38._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    iVar4 = ((int)uVar2 << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)uVar2 & 0x3800) != 0x2800) goto LAB_00146379;
LAB_0014634a:
      bVar7 = ((uint)uVar2 & 0x180000) == 0x100000;
      local_70[0] = (internal)!bVar7;
      if (bVar7) goto LAB_00146387;
    }
    else {
      if ((iVar4 == -3) && (((uint)uVar2 & 0x3800) == 0x1800)) goto LAB_0014634a;
LAB_00146379:
      local_70[0] = (internal)0x0;
LAB_00146387:
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_70,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x45d,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    local_70[0] = (internal)(((uint)local_58._0_4_ & 0x73800) == 0x32800);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_70[0]) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_70,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit2.base_units())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x460,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    if (((uint)local_58._0_4_ & 0x180000) == 0x100000) {
      uVar1 = ((int)local_58._0_4_ << 0x12) >> 0x1d;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      local_70[0] = (internal)(uVar3 < 2);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_70[0]) {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_90,(internal *)local_70,
                   (AssertionResult *)"precise::custom::is_custom_unit(cunit2.base_units())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                   ,0x461,local_90._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 8))();
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
      }
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(1.0 / (double)local_60);
    uVar2 = units::detail::unit_data::inv((unit_data *)&local_58);
    uVar3 = ~local_58._4_4_;
    if (local_58._4_4_ == 0) {
      uVar3 = 0;
    }
    local_68._4_4_ = uVar3;
    local_68._0_4_ = uVar2;
    local_70 = (undefined1  [8])
               local_38._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    iVar4 = ((int)uVar2 << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)uVar2 & 0x3800) != 0x2800) goto LAB_00146644;
LAB_00146616:
      bVar7 = ((uint)uVar2 & 0x180000) == 0x100000;
      local_a8.data_._0_1_ = (internal)!bVar7;
      if (bVar7) goto LAB_00146651;
    }
    else {
      if ((iVar4 == -3) && (((uint)uVar2 & 0x3800) == 0x1800)) goto LAB_00146616;
LAB_00146644:
      local_a8.data_._0_1_ = (internal)0x0;
LAB_00146651:
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x463,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    local_a8.data_._0_1_ = (internal)(((uint)local_68._0_4_ & 0x73800) != 0x32800);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a8.data_._0_1_) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit3.base_units())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x466,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    bVar7 = units::precise_unit::operator==(&local_48,(precise_unit *)local_60);
    local_a8.data_._0_1_ = (internal)!bVar7;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a8.data_._0_1_) {
      testing::Message::Message((Message *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_98.data_)->line,"Error with false comparison 1 index ",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_98.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,(AssertionResult *)"cunit1 == cunit2","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x468,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    bVar7 = units::precise_unit::operator==((precise_unit *)local_60,(precise_unit *)local_70);
    local_a8.data_._0_1_ = (internal)!bVar7;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a8.data_._0_1_) {
      testing::Message::Message((Message *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_98.data_)->line,"Error with false comparison 2 index ",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_98.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,(AssertionResult *)"cunit2 == cunit3","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46a,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    local_a8.data_._0_1_ =
         (internal)units::precise_unit::operator==(&local_48,(precise_unit *)local_70);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a8.data_._0_1_) {
      testing::Message::Message((Message *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_98.data_)->line,"Error with inversion ",0x15);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_98.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,(AssertionResult *)"cunit1 == cunit3","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46c,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    iVar4 = ((int)local_48.base_units_ << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)local_48.base_units_ & 0x3800) != 0x2800) goto LAB_00146aa5;
LAB_00146a77:
      bVar7 = ((uint)local_48.base_units_ & 0x180000) == 0x100000;
      local_a8.data_._0_1_ = (internal)!bVar7;
      if (bVar7) goto LAB_00146ab2;
    }
    else {
      if ((iVar4 == -3) && (((uint)local_48.base_units_ & 0x3800) == 0x1800)) goto LAB_00146a77;
LAB_00146aa5:
      local_a8.data_._0_1_ = (internal)0x0;
LAB_00146ab2:
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_98.data_)->line,"Error with custom unit detection ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_98.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46d,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    iVar4 = ((int)local_58._0_4_ << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)local_58._0_4_ & 0x3800) != 0x2800) goto LAB_00146bc8;
LAB_00146b9a:
      bVar7 = ((uint)local_58._0_4_ & 0x180000) == 0x100000;
      local_a8.data_._0_1_ = (internal)!bVar7;
      if (bVar7) goto LAB_00146bd5;
    }
    else {
      if ((iVar4 == -3) && (((uint)local_58._0_4_ & 0x3800) == 0x1800)) goto LAB_00146b9a;
LAB_00146bc8:
      local_a8.data_._0_1_ = (internal)0x0;
LAB_00146bd5:
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_98.data_)->line,"Error with custom unit detection of inverse ",
                 0x2c);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_98.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46f,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    iVar4 = ((int)local_68._0_4_ << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)local_68._0_4_ & 0x3800) != 0x2800) goto LAB_00146ceb;
LAB_00146cbd:
      bVar7 = ((uint)local_68._0_4_ & 0x180000) == 0x100000;
      local_a8.data_._0_1_ = (internal)!bVar7;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar7) goto LAB_00146cf8;
    }
    else {
      if ((iVar4 == -3) && (((uint)local_68._0_4_ & 0x3800) == 0x1800)) goto LAB_00146cbd;
LAB_00146ceb:
      local_a8.data_._0_1_ = (internal)0x0;
LAB_00146cf8:
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_98.data_)->line,"Error with custom unit detection inv inv",0x28)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_98.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)&local_a8,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x471,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    lVar6 = lVar6 + 1;
    iVar5 = iVar5 + 0x10000000;
    if (lVar6 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

TEST(customCountUnits, testAllInv)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit1.base_units()));

        EXPECT_FALSE(precise::custom::is_custom_unit(cunit1.base_units()));
        auto cunit2 = cunit1.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()));
        EXPECT_TRUE(
            precise::custom::is_custom_count_unit_inverted(
                cunit2.base_units()));
        EXPECT_FALSE(precise::custom::is_custom_unit(cunit2.base_units()));
        auto cunit3 = cunit2.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit3.base_units()));

        EXPECT_FALSE(cunit1 == cunit2)
            << "Error with false comparison 1 index " << ii;
        EXPECT_FALSE(cunit2 == cunit3)
            << "Error with false comparison 2 index " << ii;
        EXPECT_TRUE(cunit1 == cunit3) << "Error with inversion " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()))
            << "Error with custom unit detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()))
            << "Error with custom unit detection of inverse " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()))
            << "Error with custom unit detection inv inv" << ii;
    }
}